

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

seed_t lest::seed(text *opt,text *arg)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  seed_t sVar4;
  time_t tVar6;
  runtime_error *this;
  runtime_error arStack_f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  text local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48 [2];
  char local_38 [16];
  long lVar5;
  
  iVar3 = std::__cxx11::string::compare((char *)arg);
  if (iVar3 == 0) {
    tVar6 = time((time_t *)0x0);
    sVar4 = (seed_t)tVar6;
  }
  else {
    pcVar1 = (arg->_M_dataplus)._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar1,pcVar1 + arg->_M_string_length);
    bVar2 = is_number(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if (!bVar2) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_e8,"expecting \'time\' or positive number with option \'",opt);
      std::operator+(&local_a8,&local_e8,"\', got \'");
      std::operator+(&local_88,&local_a8,arg);
      std::operator+(&local_68,&local_88,"\' (try option --help)");
      std::runtime_error::runtime_error(arStack_f8,(string *)&local_68);
      std::runtime_error::runtime_error(this,arStack_f8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = (arg->_M_dataplus)._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + arg->_M_string_length);
    lVar5 = strtol(local_48[0],(char **)0x0,10);
    sVar4 = (seed_t)lVar5;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return sVar4;
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    // std::time_t: implementation dependent

    if ( arg == "time" )
        return static_cast<seed_t>( time( lest_nullptr ) );

    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}